

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitBinary(I64ToI32Lowering *this,Binary *curr)

{
  BinaryOp op;
  bool bVar1;
  LocalSet *append;
  LocalSet *any;
  Block *pBVar2;
  ostream *poVar3;
  undefined1 local_a8 [8];
  TempVar rightHigh;
  TempVar leftHigh;
  TempVar leftLow;
  TempVar rightLow;
  
  bVar1 = handleUnreachable(this,(Expression *)curr);
  if ((!bVar1) && (curr->op - AddInt64 < 0x19)) {
    getTemp((TempVar *)&leftHigh.ty,this,(Type)0x2);
    fetchOutParam((TempVar *)&rightHigh.ty,this,curr->left);
    getTemp((TempVar *)&leftLow.ty,this,(Type)0x2);
    fetchOutParam((TempVar *)local_a8,this,curr->right);
    if (((char)rightLow.pass == '\x01') ||
       (append = Builder::makeLocalSet
                           ((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                            (Index)leftLow.ty.id,curr->right), (char)leftLow.pass == '\x01')) {
      __assert_fail("!moved",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
    }
    any = Builder::makeLocalSet
                    ((this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                     (Index)leftHigh.ty.id,curr->left);
    pBVar2 = Builder::blockify((this->builder)._M_t.
                               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                               .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                               (Expression *)any,(Expression *)append);
    op = curr->op;
    switch(op) {
    case AddInt64:
      pBVar2 = lowerAdd(this,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                        (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    case SubInt64:
      pBVar2 = lowerSub(this,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                        (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    case MulInt64:
    case DivSInt64:
    case DivUInt64:
    case RemSInt64:
    case RemUInt64:
    case RotLInt64:
    case RotRInt64:
      handle_unreachable("should have been removed by now",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                         ,0x5ce);
    case AndInt64:
    case OrInt64:
    case XorInt64:
      pBVar2 = lowerBitwise(this,op,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                            (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    case ShlInt64:
    case ShrSInt64:
    case ShrUInt64:
      pBVar2 = lowerShift(this,op,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                          (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    case EqInt64:
      pBVar2 = lowerEq(this,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                       (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    case NeInt64:
      pBVar2 = lowerNe(this,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                       (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    case LtSInt64:
    case LeSInt64:
    case GtSInt64:
    case GeSInt64:
      pBVar2 = lowerSComp(this,op,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                          (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    case LtUInt64:
    case LeUInt64:
    case GtUInt64:
    case GeUInt64:
      pBVar2 = lowerUComp(this,op,pBVar2,(TempVar *)&leftHigh.ty,(TempVar *)&rightHigh.ty,
                          (TempVar *)&leftLow.ty,(TempVar *)local_a8);
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unhandled binary op ",0x14);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,curr->op);
      std::endl<char,std::char_traits<char>>(poVar3);
      abort();
    }
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)pBVar2);
    TempVar::~TempVar((TempVar *)local_a8);
    TempVar::~TempVar((TempVar *)&leftLow.ty);
    TempVar::~TempVar((TempVar *)&rightHigh.ty);
    TempVar::~TempVar((TempVar *)&leftHigh.ty);
  }
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (!binaryNeedsLowering(curr->op)) {
      return;
    }
    // left and right reachable, lower normally
    TempVar leftLow = getTemp();
    TempVar leftHigh = fetchOutParam(curr->left);
    TempVar rightLow = getTemp();
    TempVar rightHigh = fetchOutParam(curr->right);
    LocalSet* setRight = builder->makeLocalSet(rightLow, curr->right);
    LocalSet* setLeft = builder->makeLocalSet(leftLow, curr->left);
    Block* result = builder->blockify(setLeft, setRight);
    switch (curr->op) {
      case AddInt64: {
        replaceCurrent(lowerAdd(result,
                                std::move(leftLow),
                                std::move(leftHigh),
                                std::move(rightLow),
                                std::move(rightHigh)));
        break;
      }
      case SubInt64: {
        replaceCurrent(lowerSub(result,
                                std::move(leftLow),
                                std::move(leftHigh),
                                std::move(rightLow),
                                std::move(rightHigh)));
        break;
      }
      case MulInt64:
      case DivSInt64:
      case DivUInt64:
      case RemSInt64:
      case RemUInt64:
      case RotLInt64:
      case RotRInt64:
        WASM_UNREACHABLE("should have been removed by now");

      case AndInt64:
      case OrInt64:
      case XorInt64: {
        replaceCurrent(lowerBitwise(curr->op,
                                    result,
                                    std::move(leftLow),
                                    std::move(leftHigh),
                                    std::move(rightLow),
                                    std::move(rightHigh)));
        break;
      }
      case ShlInt64:
      case ShrSInt64:
      case ShrUInt64: {
        replaceCurrent(lowerShift(curr->op,
                                  result,
                                  std::move(leftLow),
                                  std::move(leftHigh),
                                  std::move(rightLow),
                                  std::move(rightHigh)));
        break;
      }
      case EqInt64: {
        replaceCurrent(lowerEq(result,
                               std::move(leftLow),
                               std::move(leftHigh),
                               std::move(rightLow),
                               std::move(rightHigh)));
        break;
      }
      case NeInt64: {
        replaceCurrent(lowerNe(result,
                               std::move(leftLow),
                               std::move(leftHigh),
                               std::move(rightLow),
                               std::move(rightHigh)));
        break;
      }
      case LtSInt64:
      case LeSInt64:
      case GtSInt64:
      case GeSInt64:
        replaceCurrent(lowerSComp(curr->op,
                                  result,
                                  std::move(leftLow),
                                  std::move(leftHigh),
                                  std::move(rightLow),
                                  std::move(rightHigh)));
        break;
      case LtUInt64:
      case LeUInt64:
      case GtUInt64:
      case GeUInt64: {
        replaceCurrent(lowerUComp(curr->op,
                                  result,
                                  std::move(leftLow),
                                  std::move(leftHigh),
                                  std::move(rightLow),
                                  std::move(rightHigh)));
        break;
      }
      default: {
        std::cerr << "Unhandled binary op " << curr->op << std::endl;
        abort();
      }
    }
  }